

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastMultiplier2
               (Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits,Vec_Int_t *vTemp,Vec_Int_t *vRes)

{
  int iVar1;
  int *pAdd0;
  int *pAdd1;
  int local_40;
  int local_3c;
  int j;
  int i;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vTemp_local;
  int nBits_local;
  int *pArg1_local;
  int *pArg0_local;
  Gia_Man_t *pNew_local;
  
  Vec_IntFill(vRes,nBits,0);
  local_3c = 0;
  while( true ) {
    if (nBits <= local_3c) {
      return;
    }
    Vec_IntFill(vTemp,local_3c,0);
    local_40 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vTemp);
      if (nBits <= iVar1) break;
      iVar1 = Gia_ManHashAnd(pNew,pArg0[local_40],pArg1[local_3c]);
      Vec_IntPush(vTemp,iVar1);
      local_40 = local_40 + 1;
    }
    iVar1 = Vec_IntSize(vTemp);
    if (iVar1 != nBits) break;
    pAdd0 = Vec_IntArray(vRes);
    pAdd1 = Vec_IntArray(vTemp);
    Wlc_BlastAdder(pNew,pAdd0,pAdd1,nBits,0);
    local_3c = local_3c + 1;
  }
  __assert_fail("Vec_IntSize(vTemp) == nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                ,0x21c,
                "void Wlc_BlastMultiplier2(Gia_Man_t *, int *, int *, int, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Wlc_BlastMultiplier2( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits, Vec_Int_t * vTemp, Vec_Int_t * vRes )
{
    int i, j;
    Vec_IntFill( vRes, nBits, 0 );
    for ( i = 0; i < nBits; i++ )
    {
        Vec_IntFill( vTemp, i, 0 );
        for ( j = 0; Vec_IntSize(vTemp) < nBits; j++ )
            Vec_IntPush( vTemp, Gia_ManHashAnd(pNew, pArg0[j], pArg1[i]) );
        assert( Vec_IntSize(vTemp) == nBits );
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), nBits, 0 );
    }
}